

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

char * str_sanitize_filename(char *aName)

{
  char *in_RDI;
  char *str;
  char *local_10;
  
  for (local_10 = in_RDI; *local_10 != '\0'; local_10 = local_10 + 1) {
    if ((((((*local_10 == '/') || (*local_10 == '<')) || (*local_10 == '>')) ||
         ((*local_10 == ':' || (*local_10 == '\"')))) ||
        ((*local_10 == '/' || ((*local_10 == '\\' || (*local_10 == '|')))))) ||
       ((*local_10 == '?' || (*local_10 == '*')))) {
      *local_10 = ' ';
    }
  }
  str_clean_whitespaces(in_RDI);
  return in_RDI;
}

Assistant:

char* str_sanitize_filename(char* aName)
{
	char *str = (char *)aName;
	while(*str)
	{
		// replace forbidden characters with a whispace
		if(*str == '/' || *str == '<' || *str == '>' || *str == ':' || *str == '"'
			|| *str == '/' || *str == '\\' || *str == '|' || *str == '?' || *str == '*')
 			*str = ' ';
		str++;
	}
	str_clean_whitespaces(aName);
	return aName;
}